

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

cJSON_bool
add_item_to_object(cJSON *object,char *string,cJSON *item,internal_hooks *hooks,
                  cJSON_bool constant_key)

{
  cJSON_bool cVar1;
  size_t sVar2;
  char *__dest;
  uint uVar3;
  
  if ((((object == item) || (object == (cJSON *)0x0)) || (string == (char *)0x0)) ||
     (item == (cJSON *)0x0)) {
    return 0;
  }
  if ((int)hooks == 0) {
    sVar2 = strlen(string);
    __dest = (char *)(*global_hooks.allocate)(sVar2 + 1);
    if (__dest == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      memcpy(__dest,string,sVar2 + 1);
    }
    if (__dest == (char *)0x0) {
      return 0;
    }
    uVar3 = item->type & 0xfffffdff;
  }
  else {
    uVar3 = item->type | 0x200;
    __dest = string;
  }
  if (((item->type & 0x200) == 0) && (item->string != (char *)0x0)) {
    (*global_hooks.deallocate)(item->string);
  }
  item->string = __dest;
  item->type = uVar3;
  cVar1 = add_item_to_array(object,item);
  return cVar1;
}

Assistant:

static cJSON_bool add_item_to_object(cJSON * const object, const char * const string, cJSON * const item, const internal_hooks * const hooks, const cJSON_bool constant_key)
{
    char *new_key = NULL;
    int new_type = cJSON_Invalid;

    if ((object == NULL) || (string == NULL) || (item == NULL) || (object == item))
    {
        return false;
    }

    if (constant_key)
    {
        new_key = (char*)cast_away_const(string);
        new_type = item->type | cJSON_StringIsConst;
    }
    else
    {
        new_key = (char*)cJSON_strdup((const unsigned char*)string, hooks);
        if (new_key == NULL)
        {
            return false;
        }

        new_type = item->type & ~cJSON_StringIsConst;
    }

    if (!(item->type & cJSON_StringIsConst) && (item->string != NULL))
    {
        hooks->deallocate(item->string);
    }

    item->string = new_key;
    item->type = new_type;

    return add_item_to_array(object, item);
}